

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O2

void __thiscall
amrex::SplineDistFcnElement2d::set_control_points
          (SplineDistFcnElement2d *this,
          vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *pts)

{
  pointer pRVar1;
  RealVect *pt;
  pointer __x;
  
  pRVar1 = (pts->super__Vector_base<amrex::RealVect,_std::allocator<amrex::RealVect>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (pts->super__Vector_base<amrex::RealVect,_std::allocator<amrex::RealVect>_>)._M_impl.
             super__Vector_impl_data._M_start; __x != pRVar1; __x = __x + 1) {
    std::vector<double,_std::allocator<double>_>::push_back(&this->control_points_x,__x->vect);
    std::vector<double,_std::allocator<double>_>::push_back(&this->control_points_y,__x->vect + 1);
  }
  return;
}

Assistant:

void SplineDistFcnElement2d::set_control_points
(std::vector<amrex::RealVect> pts) {
  for (auto & pt : pts) {
    control_points_x.push_back(pt[0]);
    control_points_y.push_back(pt[1]);
    //  std::cout << "Added point (" << pt[0] << "," << pt[1] << ")" << std::endl;
  }
}